

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

string * cmsys::SystemTools::CapitalizedWords(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  undefined1 *puVar4;
  undefined8 local_28;
  size_t i;
  string *s_local;
  string *n;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  local_28 = 0;
  do {
    uVar2 = std::__cxx11::string::size();
    if (uVar2 <= local_28) {
      return __return_storage_ptr__;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
    iVar1 = isalpha((int)*pcVar3);
    if (iVar1 != 0) {
      if (local_28 != 0) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
        iVar1 = isspace((int)*pcVar3);
        if (iVar1 == 0) goto LAB_0062fa0f;
      }
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
      iVar1 = toupper((int)*pcVar3);
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
      *puVar4 = (char)iVar1;
    }
LAB_0062fa0f:
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::string SystemTools::CapitalizedWords(const std::string& s)
{
  std::string n(s);
  for (size_t i = 0; i < s.size(); i++) {
#if defined(_MSC_VER) && defined(_MT) && defined(_DEBUG)
    // MS has an assert that will fail if s[i] < 0; setting
    // LC_CTYPE using setlocale() does *not* help. Painful.
    if ((int)s[i] >= 0 && isalpha(s[i]) &&
        (i == 0 || ((int)s[i - 1] >= 0 && isspace(s[i - 1]))))
#else
    if (isalpha(s[i]) && (i == 0 || isspace(s[i - 1])))
#endif
    {
      n[i] = static_cast<std::string::value_type>(toupper(s[i]));
    }
  }
  return n;
}